

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O0

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced(DataFlowAnalysis *this,ValueSymbol *symbol)

{
  ValueSymbol **ppVVar1;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar2;
  bool bVar3;
  long lVar4;
  equal_to<const_slang::ast::ValueSymbol_*> *this_00;
  raw_key_type *__y;
  raw_key_type *__y_00;
  undefined8 in_RSI;
  long in_RDI;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_fffffffffffffd08;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  *in_stack_fffffffffffffd10;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffd18;
  bool local_2b9;
  undefined1 local_280 [16];
  slot_type local_270 [16];
  const_iterator local_260;
  char_pointer local_250;
  table_element_pointer local_248;
  ValueSymbol **local_240;
  long local_238;
  const_iterator local_230;
  char_pointer local_220;
  table_element_pointer local_218;
  group15<boost::unordered::detail::foa::plain_integral> *local_210;
  long local_208;
  ValueSymbol **local_200;
  long local_1f8;
  char_pointer local_1f0;
  table_element_pointer local_1e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_1e0;
  ValueSymbol **local_1d0;
  long local_1c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_1c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
  local_1b0;
  ValueSymbol **local_198;
  long local_190;
  iterator local_188;
  size_t local_178;
  ValueSymbol **local_170;
  long local_168;
  uint local_15c;
  value_type *local_158;
  value_type *local_150;
  uint local_144;
  group_type *local_140;
  size_t local_138;
  pow2_quadratic_prober local_130;
  size_t local_120;
  size_t local_118;
  ValueSymbol **local_110;
  long local_108;
  group15<boost::unordered::detail::foa::plain_integral> *local_100;
  long local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  group15<boost::unordered::detail::foa::plain_integral> *local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
  local_b0;
  group15<boost::unordered::detail::foa::plain_integral> *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  group15<boost::unordered::detail::foa::plain_integral> *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  group15<boost::unordered::detail::foa::plain_integral> *local_10;
  long local_8;
  
  lVar4 = in_RDI + 0x8a8;
  local_240 = (ValueSymbol **)(local_280 + 8);
  local_270._0_8_ = in_RSI;
  local_238 = lVar4;
  local_200 = local_240;
  local_1f8 = lVar4;
  local_1d0 = local_240;
  local_1c8 = lVar4;
  local_198 = local_240;
  local_190 = lVar4;
  local_170 = local_240;
  local_168 = lVar4;
  local_178 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
              ::hash_for<slang::ast::ValueSymbol_const*>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                          *)in_stack_fffffffffffffd10,(ValueSymbol **)in_stack_fffffffffffffd08);
  ppVVar1 = local_170;
  local_118 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                              *)in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
  local_110 = ppVVar1;
  local_120 = local_178;
  local_108 = lVar4;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_130,local_118);
  do {
    local_138 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_130);
    local_140 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                          *)0x7ec7c6);
    local_140 = local_140 + local_138;
    local_144 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          (in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    if (local_144 != 0) {
      local_150 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                  ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                              *)0x7ec815);
      local_158 = local_150 + local_138 * 0xf;
      do {
        local_15c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        this_00 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                          *)0x7ec865);
        ppVVar1 = local_110;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
              ::key_from<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>>
                        ((pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x7ec892);
        bVar3 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()(this_00,ppVVar1,__y);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
          ::table_locator(&local_1b0,local_140,local_15c,local_158 + local_15c);
          goto LAB_007ec986;
        }
        local_144 = local_144 - 1 & local_144;
      } while (local_144 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    if (bVar3) {
      memset(&local_1b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
      ::table_locator(&local_1b0);
      goto LAB_007ec986;
    }
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_130,*(size_t *)(in_RDI + 0x8b8));
  } while (bVar3);
  memset(&local_1b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
  ::table_locator(&local_1b0);
LAB_007ec986:
  local_188 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
              ::make_iterator((locator *)0x7ec993);
  local_1e0.pc_ = local_188.pc_;
  local_1e0.p_ = local_188.p_;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_1c0,&local_1e0);
  local_1f0 = local_1c0.pc_;
  local_1e8 = local_1c0.p_;
  local_250 = local_1c0.pc_;
  local_248 = local_1c0.p_;
  local_260 = boost::unordered::
              unordered_flat_map<const_slang::ast::ValueSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
              ::end((unordered_flat_map<const_slang::ast::ValueSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                     *)0x7eca22);
  bVar3 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffd10,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffd08);
  local_2b9 = true;
  if (!bVar3) {
    lVar4 = in_RDI + 0xb38;
    local_280[0] = local_270[0].n;
    local_280[1] = local_270[1].n;
    local_280[2] = local_270[2].n;
    local_280[3] = local_270[3].n;
    local_280[4] = local_270[4].n;
    local_280[5] = local_270[5].n;
    local_280[6] = local_270[6].n;
    local_280[7] = local_270[7].n;
    local_210 = (group15<boost::unordered::detail::foa::plain_integral> *)local_280;
    local_208 = lVar4;
    local_100 = local_210;
    local_f8 = lVar4;
    local_d0 = local_210;
    local_c8 = lVar4;
    local_98 = local_210;
    local_90 = lVar4;
    local_70 = local_210;
    local_68 = lVar4;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
               ::hash_for<slang::ast::ValueSymbol_const*>
                         (in_stack_fffffffffffffd10,(ValueSymbol **)in_stack_fffffffffffffd08);
    pgVar2 = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
               ::position_for(in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    local_10 = pgVar2;
    local_20 = local_78;
    local_8 = lVar4;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                           *)0x7ecbcb);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           (in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                               *)0x7ecc1a);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffd10 =
               (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                          *)0x7ecc6a);
          in_stack_fffffffffffffd18 = local_10;
          __y_00 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                   ::
                   key_from<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>>
                             ((pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                               *)0x7ecc97);
          bVar3 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()
                            ((equal_to<const_slang::ast::ValueSymbol_*> *)in_stack_fffffffffffffd10,
                             (ValueSymbol **)in_stack_fffffffffffffd18,__y_00);
          if (bVar3) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_007ecd8b;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
      if (bVar3) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
        ::table_locator(&local_b0);
        goto LAB_007ecd8b;
      }
      bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(in_RDI + 0xb48));
    } while (bVar3);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
    ::table_locator(&local_b0);
LAB_007ecd8b:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
               ::make_iterator((locator *)0x7ecd98);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = local_c0.pc_;
    local_e8 = local_c0.p_;
    local_220 = local_c0.pc_;
    local_218 = local_c0.p_;
    local_230 = boost::unordered::
                unordered_flat_map<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                ::end((unordered_flat_map<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                       *)0x7ece27);
    local_2b9 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  return local_2b9;
}

Assistant:

bool isReferenced(const ValueSymbol& symbol) const {
        return symbolToSlot.contains(&symbol) || rvalues.contains(&symbol);
    }